

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::PrintImpl
          (Printer *this,string_view format,
          Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,PrintOptions opts)

{
  pointer ppVar1;
  ulong uVar2;
  size_t sVar3;
  AnnotationCollector *pAVar4;
  pointer pfVar5;
  pointer pCVar6;
  unsigned_long uVar7;
  pointer pfVar8;
  string_view var;
  string_view var_00;
  string_view v;
  string_view str;
  undefined4 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined1 uVar14;
  pointer ppVar15;
  pointer ppVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  long lVar22;
  reference pbVar23;
  pointer prVar24;
  LogMessage *pLVar25;
  pointer pCVar26;
  char *pcVar27;
  long extraout_RDX;
  long lVar28;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar29;
  byte bVar30;
  pointer pLVar31;
  size_type sVar32;
  ulong uVar33;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *this_01;
  undefined8 in_R9;
  size_t sVar34;
  ulong uVar35;
  size_t sVar36;
  string_view sVar37;
  basic_string_view<char,_std::char_traits<char>_> bVar38;
  basic_string_view<char,_std::char_traits<char>_> bVar39;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view var_01;
  string_view expected_03;
  string_view str_00;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_04;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_05;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_06;
  string_view message_07;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_08;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_09;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_01;
  PrintOptions opts_00;
  PrintOptions opts_01;
  PrintOptions opts_02;
  PrintOptions opts_03;
  PrintOptions opts_04;
  PrintOptions opts_05;
  PrintOptions opts_06;
  PrintOptions opts_07;
  PrintOptions opts_08;
  PrintOptions opts_09;
  PrintOptions opts_10;
  PrintOptions opts_11;
  PrintOptions opts_12;
  undefined4 local_258;
  undefined4 uStackY_254;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined7 in_stack_fffffffffffffdb8;
  byte in_stack_fffffffffffffdbf;
  size_t local_240;
  optional<google::protobuf::io::Printer::ValueImpl<false>_> sub;
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  annot_stack;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_local;
  value_type chunk;
  char c;
  undefined7 uStack_157;
  size_t local_150;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  annot_records;
  Format fmt;
  string_view text_1;
  bool local_c8;
  optional<google::protobuf::io::Printer::AnnotationRecord> same_name_record;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  
  args_local.len_ = args.len_;
  args_local.ptr_ = args.ptr_;
  sVar3 = this->indent_;
  this_00 = &this->line_start_variables_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  if (opts.use_substitution_map == true) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)&this->substitutions_);
  }
  TokenizeFormat(&fmt,this,format,&opts);
  PrintCodegenTrace(this,(_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         opts.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   );
  annot_stack.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  annot_stack.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  annot_stack.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  annot_records.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  annot_records.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  annot_records.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar35 = 0;
  bVar21 = false;
  local_240 = 0;
  lVar28 = extraout_RDX;
  do {
    if ((ulong)((long)fmt.lines.
                      super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)fmt.lines.
                      super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar35) {
      opts_10.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
      opts_10.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      opts_10.checks_are_debug_only = opts.checks_are_debug_only;
      opts_10.use_substitution_map = opts.use_substitution_map;
      opts_10.allow_digit_substitutions = opts.allow_digit_substitutions;
      opts_10.strip_spaces_around_vars = opts.strip_spaces_around_vars;
      opts_10.strip_raw_string_indentation = opts.strip_raw_string_indentation;
      message_08.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__4,std::__cxx11::string>
      ;
      message_08.ptr_.obj = &sub;
      opts_09.use_annotation_frames = SUB81(lVar28,0);
      opts_09.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
      opts_09.checks_are_debug_only = (bool)opts.checks_are_debug_only;
      opts_09.use_substitution_map = (bool)opts.use_substitution_map;
      opts_09.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
      opts_09.allow_digit_substitutions = opts.allow_digit_substitutions;
      opts_09.strip_spaces_around_vars = opts.strip_spaces_around_vars;
      opts_09.strip_raw_string_indentation = opts.strip_raw_string_indentation;
      sub.super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
      _M_payload.
      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>._M_payload.
      _0_8_ = format._M_len;
      sub.super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
      _M_payload.
      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>._M_payload.
      _8_8_ = format._M_str;
      Validate(local_240 == args_local.len_,opts_09,message_08);
      message_09.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__5,std::__cxx11::string>
      ;
      message_09.ptr_.obj = &sub;
      opts_10.use_annotation_frames = SUB81(extraout_RDX_09,0);
      sub.super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
      _M_payload.
      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>._M_payload.
      _0_8_ = this;
      sub.super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
      _M_payload.
      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>._M_payload.
      _8_8_ = format._M_len;
      sub.super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
      _M_payload.
      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>._M_payload.
      _16_8_ = format._M_str;
      Validate(annot_stack.
               super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               annot_stack.
               super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,opts_10,message_09);
      if ((fmt.is_raw_string == true) && (this->at_start_of_line_ == false)) {
        WriteRaw(this,"\n",1);
        this->at_start_of_line_ = true;
      }
      std::
      _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
      ::~_Vector_base(&annot_records.
                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                     );
      std::
      vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&annot_stack);
      std::
      vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ::~vector(&fmt.lines);
      this->indent_ = sVar3;
      return;
    }
    pLVar31 = fmt.lines.
              super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar35;
    if ((uVar35 != 0 && !bVar21) &&
       (((fmt.is_raw_string != true ||
         (pLVar31[-1].chunks.
          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          pLVar31[-1].chunks.
          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_finish)) || ((this->at_start_of_line_ & 1U) == 0)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,"\n",1);
      this->at_start_of_line_ = true;
    }
    this->indent_ = pLVar31->indent + sVar3;
    uVar33 = 0;
    bVar21 = false;
    while( true ) {
      pCVar26 = (pLVar31->chunks).
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = (long)(pLVar31->chunks).
                     super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar26;
      lVar28 = lVar22 % 0x18;
      if ((ulong)(lVar22 / 0x18) <= uVar33) break;
      sVar36 = pCVar26[uVar33].text._M_len;
      pcVar27 = pCVar26[uVar33].text._M_str;
      chunk._16_8_ = *(undefined8 *)&pCVar26[uVar33].is_var;
      chunk.text._M_len = sVar36;
      chunk.text._M_str = pcVar27;
      if ((chunk._16_8_ & 1) == 0) {
        WriteRaw(this,pcVar27,sVar36);
      }
      else if (sVar36 == 0) {
        WriteRaw(this,&(this->options_).variable_delimiter,1);
      }
      else {
        chunk.text._M_len._0_4_ = (undefined4)sVar36;
        chunk.text._M_len._4_4_ = (undefined4)(sVar36 >> 0x20);
        chunk.text._M_str._0_4_ = SUB84(pcVar27,0);
        chunk.text._M_str._4_4_ = (undefined4)((ulong)pcVar27 >> 0x20);
        local_258 = (undefined4)chunk.text._M_len;
        uStackY_254 = chunk.text._M_len._4_4_;
        uVar40 = chunk.text._M_str._0_4_;
        uVar41 = chunk.text._M_str._4_4_;
        if ((this->substitution_listener_).
            super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
            .
            super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
            .invoker_ !=
            (InvokerType<false,_void,_std::basic_string_view<char>,_google::protobuf::io::Printer::SourceLocation>
             *)0x0) {
          absl::lts_20250127::internal_any_invocable::
          Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
          ::operator()(&(this->substitution_listener_).
                        super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                       ,sVar36,pcVar27);
          pcVar27 = chunk.text._M_str;
        }
        chunk.text._M_str = pcVar27;
        if (opts.use_curly_brace_substitutions == true) {
          sVar37._M_str = (char *)pCVar26;
          sVar37._M_len = (size_t)"{";
          bVar17 = absl::lts_20250127::ConsumePrefix
                             ((lts_20250127 *)&local_258,(Nonnull<absl::string_view_*>)0x1,sVar37);
          bVar12 = opts.strip_raw_string_indentation;
          bVar11 = opts.strip_spaces_around_vars;
          bVar10 = opts.allow_digit_substitutions;
          bVar18 = opts.use_curly_brace_substitutions;
          uVar9 = opts._0_4_;
          if (bVar17) {
            lVar28 = CONCAT44(uStackY_254,local_258);
            opts_11.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
            opts_11.loc.
            super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                 opts.loc.
                 super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                 _M_payload.
                 super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
            opts_11.checks_are_debug_only = opts.checks_are_debug_only;
            opts_11.use_substitution_map = opts.use_substitution_map;
            opts_11.allow_digit_substitutions = opts.allow_digit_substitutions;
            opts_11.strip_spaces_around_vars = opts.strip_spaces_around_vars;
            opts_11.strip_raw_string_indentation = opts.strip_raw_string_indentation;
            message._M_str = "expected single-digit variable";
            message._M_len = 0x1e;
            opts_00.use_annotation_frames = SUB81(extraout_RDX_00,0);
            opts_00.loc.
            super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                 (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                 (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                 opts.loc.
                 super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                 _M_payload.
                 super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
            opts_00.checks_are_debug_only = (bool)opts.checks_are_debug_only;
            opts_00.use_substitution_map = (bool)opts.use_substitution_map;
            opts_00.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
            opts_00.allow_digit_substitutions = opts.allow_digit_substitutions;
            opts_00.strip_spaces_around_vars = opts.strip_spaces_around_vars;
            opts_00.strip_raw_string_indentation = opts.strip_raw_string_indentation;
            Validate(lVar28 == 1,opts_00,message);
            if ((lVar28 == 1) &&
               (bVar30 = *(char *)CONCAT44(uVar41,uVar40) - 0x30,
               message_00._M_str = "expected digit after {", message_00._M_len = 0x16,
               opts_01.use_annotation_frames = SUB81(extraout_RDX_01,0),
               opts_01.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                    (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                    (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                    (short)uVar9, opts_01.checks_are_debug_only = (bool)SUB41(uVar9,2),
               opts_01.use_substitution_map = (bool)SUB41(uVar9,3),
               opts_01.use_curly_brace_substitutions = bVar18,
               opts_01.allow_digit_substitutions = bVar10, opts_01.strip_spaces_around_vars = bVar11
               , opts_01.strip_raw_string_indentation = bVar12,
               Validate(bVar30 < 10,opts_01,message_00), bVar30 < 10)) {
              sVar36 = (long)*(char *)CONCAT44(uVar41,uVar40) - 0x31;
              opts_11.use_annotation_frames = SUB81(in_R9,0);
              bVar18 = ValidateIndexLookupInBounds(this,sVar36,local_240,args_local.len_,opts_11);
              if (bVar18) {
                IndentIfAtStart(this);
                sVar34 = (this->sink_).bytes_written_;
                pbVar23 = absl::lts_20250127::
                          Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator[](&args_local,sVar36);
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._8_8_ = 0;
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._0_8_ = sVar34;
                std::__cxx11::string::string
                          ((string *)
                           ((long)&sub.
                                   super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                   ._M_payload._M_value.value.
                                   super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
                                   .
                                   super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                   .
                                   super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                   .
                                   super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                   .
                                   super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                   .
                                   super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                   ._M_u + 0x10),(string *)pbVar23);
                std::
                vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                ::
                emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>
                          ((vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                            *)&annot_stack,
                           (pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sub);
                local_240 = local_240 + (sVar36 == local_240);
                this_01 = (string *)
                          ((long)&sub.
                                  super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                  ._M_payload._M_value.value.
                                  super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
                                  .
                                  super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                  .
                                  super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                  .
                                  super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                  .
                                  super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                  .
                                  super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                                  ._M_u + 0x10);
LAB_00c9b2ca:
                std::__cxx11::string::~string(this_01);
              }
            }
          }
          else {
            expected._M_str = (char *)pCVar26;
            expected._M_len = (size_t)"}";
            bVar18 = absl::lts_20250127::ConsumePrefix
                               ((lts_20250127 *)&local_258,(Nonnull<absl::string_view_*>)0x1,
                                expected);
            ppVar16 = annot_stack.
                      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppVar15 = annot_stack.
                      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (!bVar18) goto LAB_00c9b2d4;
            opts_02.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
            opts_02.loc.
            super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                 opts.loc.
                 super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                 _M_payload.
                 super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
            opts_02.checks_are_debug_only = opts.checks_are_debug_only;
            opts_02.use_substitution_map = opts.use_substitution_map;
            opts_02.allow_digit_substitutions = opts.allow_digit_substitutions;
            opts_02.strip_spaces_around_vars = opts.strip_spaces_around_vars;
            opts_02.strip_raw_string_indentation = opts.strip_raw_string_indentation;
            message_01._M_str = "unexpected end of annotation";
            message_01._M_len = 0x1c;
            opts_02.use_annotation_frames = SUB81(extraout_RDX_02,0);
            Validate(annot_stack.
                     super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                     annot_stack.
                     super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,opts_02,message_01);
            if (ppVar15 != ppVar16) {
              annot_stack.
              super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].first.second =
                   (this->sink_).bytes_written_;
              pAVar4 = (this->options_).annotation_collector;
              if (pAVar4 != (AnnotationCollector *)0x0) {
                (*pAVar4->_vptr_AnnotationCollector[4])
                          (pAVar4,annot_stack.
                                  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
              }
              this_01 = (string *)
                        &annot_stack.
                         super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].second;
              annot_stack.
              super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   annot_stack.
                   super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              goto LAB_00c9b2ca;
            }
          }
        }
        else {
LAB_00c9b2d4:
          bVar39 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
          bVar38 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
          if (opts.strip_spaces_around_vars == true) {
            str_00._M_len._4_4_ = uVar41;
            str_00._M_len._0_4_ = uVar40;
            str_00._M_str = (char *)0x0;
            sVar37 = absl::lts_20250127::StripLeadingAsciiWhitespace
                               ((lts_20250127 *)CONCAT44(uStackY_254,local_258),str_00);
            local_258 = (undefined4)sVar37._M_len;
            uStackY_254 = sVar37._M_len._4_4_;
            uVar40 = sVar37._M_str._0_4_;
            uVar41 = sVar37._M_str._4_4_;
            bVar38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&chunk.text,0,chunk.text._M_len - sVar37._M_len);
            str._M_len._4_4_ = uVar41;
            str._M_len._0_4_ = uVar40;
            str._M_str._0_7_ = in_stack_fffffffffffffdb8;
            str._M_str._7_1_ = in_stack_fffffffffffffdbf;
            sVar37 = absl::lts_20250127::StripTrailingAsciiWhitespace(str);
            local_258 = (undefined4)sVar37._M_len;
            uStackY_254 = sVar37._M_len._4_4_;
            uVar40 = sVar37._M_str._0_4_;
            uVar41 = sVar37._M_str._4_4_;
            bVar39 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&chunk.text,sVar37._M_len + bVar38._M_len,0xffffffffffffffff);
          }
          bVar17 = opts.use_annotation_frames;
          bVar12 = opts.strip_raw_string_indentation;
          bVar11 = opts.strip_spaces_around_vars;
          bVar10 = opts.allow_digit_substitutions;
          bVar18 = opts.use_curly_brace_substitutions;
          uVar9 = opts._0_4_;
          lVar28 = CONCAT44(uStackY_254,local_258);
          opts_08.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
          opts_08.loc.
          super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload
          .super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
               opts.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
          opts_08.checks_are_debug_only = opts.checks_are_debug_only;
          opts_08.use_substitution_map = opts.use_substitution_map;
          opts_08.allow_digit_substitutions = opts.allow_digit_substitutions;
          opts_08.strip_spaces_around_vars = opts.strip_spaces_around_vars;
          opts_08.strip_raw_string_indentation = opts.strip_raw_string_indentation;
          pcVar27 = (char *)0x19;
          message_02._M_str = "unexpected empty variable";
          message_02._M_len = 0x19;
          opts_03.use_annotation_frames = bVar39._M_str._0_1_;
          opts_03.loc.
          super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload
          .super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
               (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
               (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
               opts.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
          opts_03.checks_are_debug_only = (bool)opts.checks_are_debug_only;
          opts_03.use_substitution_map = (bool)opts.use_substitution_map;
          opts_03.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
          opts_03.allow_digit_substitutions = opts.allow_digit_substitutions;
          opts_03.strip_spaces_around_vars = opts.strip_spaces_around_vars;
          opts_03.strip_raw_string_indentation = opts.strip_raw_string_indentation;
          Validate(lVar28 != 0,opts_03,message_02);
          if (lVar28 != 0) {
            expected_00._M_str = pcVar27;
            expected_00._M_len = (size_t)"_start$";
            bVar19 = absl::lts_20250127::ConsumePrefix
                               ((lts_20250127 *)&local_258,
                                (Nonnull<absl::string_view_*>)&DAT_00000007,expected_00);
            expected_01._M_str = pcVar27;
            expected_01._M_len = (size_t)"_end$";
            bVar20 = absl::lts_20250127::ConsumePrefix
                               ((lts_20250127 *)&local_258,
                                (Nonnull<absl::string_view_*>)&DAT_00000005,expected_01);
            if (((bVar20 || bVar19) & bVar17) == 1) {
              if (bVar19) {
                IndentIfAtStart(this);
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._16_8_ = (this->sink_).bytes_written_;
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._0_8_ = CONCAT44(uStackY_254,local_258);
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._8_8_ = CONCAT44(uVar41,uVar40);
                std::
                vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>>
                ::
                emplace_back<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>
                          ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>>
                            *)&annot_records,
                           (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                            *)&sub);
                uVar33 = uVar33 + 1;
                pCVar26 = (pLVar31->chunks).
                          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (uVar33 < (ulong)(((long)(pLVar31->chunks).
                                            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pCVar26) / 0x18)) {
                  sub.
                  super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                  .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                  _M_payload._0_8_ = pCVar26[uVar33].text._M_len;
                  sub.
                  super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                  .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                  _M_payload._8_8_ = pCVar26[uVar33].text._M_str;
                  do {
                    expected_02._M_str = (char *)pCVar26;
                    expected_02._M_len = (size_t)" ";
                    bVar18 = absl::lts_20250127::ConsumePrefix
                                       ((lts_20250127 *)&sub,(Nonnull<absl::string_view_*>)0x1,
                                        expected_02);
                  } while (bVar18);
                  WriteRaw(this,(char *)sub.
                                        super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                        ._M_payload._8_8_,
                           sub.
                           super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                           .
                           super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                           ._M_payload._0_8_);
                }
              }
              else {
                pCVar26 = (pLVar31->chunks).
                          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pCVar6 = (pLVar31->chunks).
                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar1 = annot_records.
                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
                sVar36 = (ppVar1->first)._M_len;
                pcVar27 = annot_records.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_str;
                uVar7 = annot_records.
                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].second;
                bVar38._M_len._4_4_ = uStackY_254;
                bVar38._M_len._0_4_ = local_258;
                bVar38._M_str._0_4_ = uVar40;
                bVar38._M_str._4_4_ = uVar41;
                annot_records.
                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     annot_records.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
                bVar17 = std::operator==(ppVar1->first,bVar38);
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._24_8_ = CONCAT44(uStackY_254,local_258);
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._32_8_ = CONCAT44(uVar41,uVar40);
                message_04.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
                ;
                message_04.ptr_.obj = &sub;
                opts_05.use_annotation_frames = SUB81(extraout_RDX_06,0);
                opts_05.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (short)uVar9;
                opts_05.checks_are_debug_only = (bool)SUB41(uVar9,2);
                opts_05.use_substitution_map = (bool)SUB41(uVar9,3);
                opts_05.use_curly_brace_substitutions = bVar18;
                opts_05.allow_digit_substitutions = bVar10;
                opts_05.strip_spaces_around_vars = bVar11;
                opts_05.strip_raw_string_indentation = bVar12;
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._0_8_ = sVar36;
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._8_8_ = pcVar27;
                sub.
                super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
                _M_payload.
                super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
                _M_payload._16_8_ = uVar7;
                Validate(bVar17,opts_05,message_04);
                bVar21 = (bool)(bVar21 | (long)pCVar26 - (long)pCVar6 == 0x18);
                if (bVar17) {
                  var_00._M_len._4_4_ = uStackY_254;
                  var_00._M_len._0_4_ = local_258;
                  var_00._M_str._0_4_ = uVar40;
                  var_00._M_str._4_4_ = uVar41;
                  pfVar8 = (this->annotation_lookups_).
                           super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  frames_00.len_ =
                       (long)(this->annotation_lookups_).
                             super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar8 >> 5;
                  frames_00.ptr_ = pfVar8;
                  anon_unknown_4::
                  LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                            ((optional<google::protobuf::io::Printer::AnnotationRecord> *)&sub,
                             var_00,frames_00);
                  uVar14 = sub.
                           super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                           .
                           super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                           ._M_payload._64_1_;
                  text_1._M_len = CONCAT44(uStackY_254,local_258);
                  text_1._M_str = (char *)CONCAT44(uVar41,uVar40);
                  message_05.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__2,std::__cxx11::string>
                  ;
                  message_05.ptr_.obj = &text_1;
                  opts_06.use_annotation_frames = SUB81(extraout_RDX_07,0);
                  opts_06.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (short)uVar9;
                  opts_06.checks_are_debug_only = (bool)SUB41(uVar9,2);
                  opts_06.use_substitution_map = (bool)SUB41(uVar9,3);
                  opts_06.use_curly_brace_substitutions = bVar18;
                  opts_06.allow_digit_substitutions = bVar10;
                  opts_06.strip_spaces_around_vars = bVar11;
                  opts_06.strip_raw_string_indentation = bVar12;
                  Validate((bool)sub.
                                 super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                 ._M_payload._64_1_,opts_06,message_05);
                  if ((uVar14 != '\0') &&
                     (pAVar4 = (this->options_).annotation_collector,
                     pAVar4 != (AnnotationCollector *)0x0)) {
                    in_R9 = sub.
                            super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                            ._M_payload._56_8_;
                    (*pAVar4->_vptr_AnnotationCollector[3])
                              (pAVar4,uVar7,(this->sink_).bytes_written_,
                               (undefined1 *)
                               ((long)&sub.
                                       super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                       ._M_payload + 0x18),
                               (_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                *)&sub);
                  }
                  std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                  _M_reset((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            *)&sub);
                }
              }
            }
            else {
              sub.
              super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>.
              _M_engaged = false;
              same_name_record.
              super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>.
              _M_engaged = false;
              if (((bVar10 & 1U) == 0) || (9 < (byte)(*(char *)CONCAT44(uVar41,uVar40) - 0x30U))) {
                pfVar5 = (this->var_lookups_).
                         super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                frames_01.ptr_ =
                     (pointer)((long)(this->var_lookups_).
                                     super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar5 >> 5)
                ;
                var_01._M_str = (char *)pfVar5;
                var_01._M_len = (size_t)CONCAT44(uVar41,uVar40);
                frames_01.len_._0_4_ = SUB84(in_R9,0);
                frames_01.len_._4_1_ = SUB81(in_R9,4);
                frames_01.len_._5_3_ = SUB83(in_R9,5);
                io::(anonymous_namespace)::
                LookupInFrameStack<google::protobuf::io::Printer::ValueImpl<false>>
                          ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)&text_1,
                           (_anonymous_namespace_ *)CONCAT44(uStackY_254,local_258),var_01,frames_01
                          );
                std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                _M_move_assign((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                *)&sub,(_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                        *)&text_1);
                std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                _M_reset((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_> *
                         )&text_1);
                uVar29 = extraout_RDX_04;
                if ((bVar17 & 1U) != 0) {
                  var._M_len._4_4_ = uStackY_254;
                  var._M_len._0_4_ = local_258;
                  var._M_str._0_4_ = uVar40;
                  var._M_str._4_4_ = uVar41;
                  pfVar8 = (this->annotation_lookups_).
                           super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  frames.len_ = (long)(this->annotation_lookups_).
                                      super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar8 >> 5
                  ;
                  frames.ptr_ = pfVar8;
                  anon_unknown_4::
                  LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                            ((optional<google::protobuf::io::Printer::AnnotationRecord> *)&text_1,
                             var,frames);
                  std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                  _M_move_assign((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                  *)&same_name_record,
                                 (_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                  *)&text_1);
                  std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                  _M_reset((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            *)&text_1);
                  uVar29 = extraout_RDX_05;
                }
LAB_00c9b760:
                bVar17 = sub.
                         super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                         .
                         super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                         ._M_engaged;
                text_1._M_len = CONCAT44(uStackY_254,local_258);
                text_1._M_str = (char *)CONCAT44(uVar41,uVar40);
                message_06.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__3,std::__cxx11::string>
                ;
                message_06.ptr_.obj = &text_1;
                opts_07.use_annotation_frames = SUB81(uVar29,0);
                opts_07.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (short)uVar9;
                opts_07.checks_are_debug_only = (bool)SUB41(uVar9,2);
                opts_07.use_substitution_map = (bool)SUB41(uVar9,3);
                opts_07.use_curly_brace_substitutions = bVar18;
                opts_07.allow_digit_substitutions = bVar10;
                opts_07.strip_spaces_around_vars = bVar11;
                opts_07.strip_raw_string_indentation = bVar12;
                Validate(sub.
                         super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                         .
                         super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                         ._M_engaged,opts_07,message_06);
                if (bVar17 != false) {
                  if (sub.
                      super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                      .
                      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                      ._M_payload._M_value.value.
                      super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
                      .
                      super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                      .
                      super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                      .super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                      .super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                      .
                      super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                      ._M_index == '\0') {
                    sVar34 = (this->sink_).bytes_written_;
                    if (this->at_start_of_line_ == true) {
                      if (sub.
                          super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                          ._M_payload._0_8_ == 0) {
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)this_00,
                                   (basic_string_view<char,_std::char_traits<char>_> *)&local_258);
                        goto LAB_00c9b7d4;
                      }
LAB_00c9b7e0:
                      WriteRaw(this,bVar38._M_str,bVar38._M_len);
                      WriteRaw(this,(char *)sub.
                                            super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                            ._M_payload._8_8_,
                               sub.
                               super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                               .
                               super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                               ._M_payload._0_8_);
                      sVar34 = (this->sink_).bytes_written_;
                      sVar36 = sVar34 - sub.
                                        super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                        ._M_payload._0_8_;
                      WriteRaw(this,bVar39._M_str,bVar39._M_len);
                      goto LAB_00c9b872;
                    }
LAB_00c9b7d4:
                    if (sub.
                        super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                        .
                        super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                        ._M_payload._0_8_ != 0) goto LAB_00c9b7e0;
LAB_00c9b877:
                    sVar36 = sVar34;
                    if (sub.
                        super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                        .
                        super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                        ._M_payload._M_value.consume_parens_if_empty == true) {
                      text_1._M_len = this->paren_depth_ + 1;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      emplace_back<unsigned_long>(&this->paren_depth_to_omit_,&text_1._M_len);
                    }
                  }
                  else {
                    if (sub.
                        super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                        .
                        super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                        ._M_payload._M_value.value.
                        super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
                        .
                        super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                        .
                        super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                        .
                        super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                        .
                        super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                        .
                        super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_>
                        ._M_index != '\x01') {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&text_1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                 ,0x2ea,"fnc != nullptr");
LAB_00c9bc6f:
                      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                                ((LogMessageFatal *)&text_1);
                    }
                    message_07._M_str =
                         "substitution that resolves to callback cannot contain whitespace";
                    message_07._M_len = 0x40;
                    opts_08.use_annotation_frames = SUB81(extraout_RDX_08,0);
                    Validate(bVar38._M_len == 0 && bVar39._M_len == 0,opts_08,message_07);
                    sVar36 = (this->sink_).bytes_written_;
                    bVar18 = std::function<bool_()>::operator()((function<bool_()> *)&sub);
                    if (!bVar18) {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&text_1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                 ,0x2f1,"(*fnc)()");
                      pLVar25 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                          ((LogMessage *)&text_1,
                                           (char (*) [46])
                                           "recursive call encountered while evaluating \"");
                      v._M_len._4_4_ = uStackY_254;
                      v._M_len._0_4_ = local_258;
                      v._M_str._0_4_ = uVar40;
                      v._M_str._4_4_ = uVar41;
                      pLVar25 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar25,v);
                      absl::lts_20250127::log_internal::LogMessage::operator<<
                                (pLVar25,(char (*) [2])0xfe758f);
                      goto LAB_00c9bc6f;
                    }
                    sVar34 = (this->sink_).bytes_written_;
LAB_00c9b872:
                    if (sVar36 == sVar34) goto LAB_00c9b877;
                  }
                  uVar13 = sub.
                           super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                           .
                           super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                           ._M_payload._M_value.consume_after._M_string_length;
                  uVar29 = sub.
                           super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                           .
                           super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                           ._M_payload._M_value.consume_after._M_dataplus._M_p;
                  if (sub.
                      super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>
                      .
                      super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                      ._M_payload._M_value.consume_after._M_string_length != 0) {
                    uVar2 = uVar33 + 1;
                    pCVar26 = (pLVar31->chunks).
                              super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((uVar2 < (ulong)(((long)(pLVar31->chunks).
                                                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pCVar26) / 0x18)) && (pCVar26[uVar2].is_var == false)
                       ) {
                      text_1._M_len = pCVar26[uVar2].text._M_len;
                      text_1._M_str = pCVar26[uVar2].text._M_str;
                      sVar32 = 0;
                      do {
                        if (uVar13 == sVar32) break;
                        _c = CONCAT71(uStack_157,*(undefined1 *)(uVar29 + sVar32));
                        expected_03._M_str = (char *)pCVar26;
                        expected_03._M_len = (size_t)&c;
                        bVar18 = absl::lts_20250127::ConsumePrefix
                                           ((lts_20250127 *)&text_1,
                                            (Nonnull<absl::string_view_*>)0x1,expected_03);
                        sVar32 = sVar32 + 1;
                      } while (!bVar18);
                      WriteRaw(this,text_1._M_str,text_1._M_len);
                      uVar33 = uVar2;
                    }
                  }
                  if ((same_name_record.
                       super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                       ._M_payload.
                       super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                       .
                       super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                       ._M_engaged == true) &&
                     (pAVar4 = (this->options_).annotation_collector,
                     pAVar4 != (AnnotationCollector *)0x0)) {
                    in_R9 = same_name_record.
                            super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            ._M_payload._M_value.semantic.
                            super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                    ;
                    (*pAVar4->_vptr_AnnotationCollector[3])
                              (pAVar4,sVar36,sVar34,
                               (undefined1 *)
                               ((long)&same_name_record.
                                       super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                       ._M_payload + 0x18),&same_name_record);
                  }
                  if ((opts.use_substitution_map == true) &&
                     (_c = sVar36, local_150 = sVar34,
                     absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     ::
                     emplace<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::pair<unsigned_long,_unsigned_long>,_0>
                               ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
                                 *)&text_1,
                                (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                 *)&this->substitutions_,
                                (basic_string_view<char,_std::char_traits<char>_> *)&local_258,
                                (pair<unsigned_long,_unsigned_long> *)&c), local_c8 == false)) {
                    prVar24 = absl::lts_20250127::container_internal::
                              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                              ::iterator::operator->((iterator *)&text_1);
                    (prVar24->second).first = 1;
                    (prVar24->second).second = 0;
                  }
                }
              }
              else {
                lVar28 = CONCAT44(uStackY_254,local_258);
                message_03._M_str = "expected single-digit variable";
                message_03._M_len = 0x1e;
                opts_04.use_annotation_frames = SUB41(uVar40,0);
                opts_04.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (short)uVar9;
                opts_04.checks_are_debug_only = (bool)SUB41(uVar9,2);
                opts_04.use_substitution_map = (bool)SUB41(uVar9,3);
                opts_04.use_curly_brace_substitutions = bVar18;
                opts_04.allow_digit_substitutions = bVar10;
                opts_04.strip_spaces_around_vars = bVar11;
                opts_04.strip_raw_string_indentation = bVar12;
                Validate(lVar28 == 1,opts_04,message_03);
                if (lVar28 == 1) {
                  sVar36 = (long)*(char *)CONCAT44(uVar41,uVar40) - 0x31;
                  opts_12.use_annotation_frames = SUB81(in_R9,0);
                  opts_12.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (short)uVar9;
                  opts_12.checks_are_debug_only = (bool)SUB41(uVar9,2);
                  opts_12.use_substitution_map = (bool)SUB41(uVar9,3);
                  opts_12.use_curly_brace_substitutions = bVar18;
                  opts_12.allow_digit_substitutions = bVar10;
                  opts_12.strip_spaces_around_vars = bVar11;
                  opts_12.strip_raw_string_indentation = bVar12;
                  bVar17 = ValidateIndexLookupInBounds
                                     (this,sVar36,local_240,args_local.len_,opts_12);
                  if (bVar17) {
                    in_stack_fffffffffffffdbf = sVar36 == local_240;
                    pbVar23 = absl::lts_20250127::
                              Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator[](&args_local,sVar36);
                    std::optional<google::protobuf::io::Printer::ValueImpl<false>>::operator=
                              ((optional<google::protobuf::io::Printer::ValueImpl<false>> *)&sub,
                               pbVar23);
                    local_240 = local_240 + in_stack_fffffffffffffdbf;
                    uVar29 = extraout_RDX_03;
                    goto LAB_00c9b760;
                  }
                }
              }
              std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_reset
                        ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                         &same_name_record);
              std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
              _M_reset((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_> *)
                       &sub);
            }
          }
        }
      }
      uVar33 = uVar33 + 1;
    }
    uVar35 = uVar35 + 1;
  } while( true );
}

Assistant:

void Printer::PrintImpl(absl::string_view format,
                        absl::Span<const std::string> args, PrintOptions opts) {
  // Inside of this function, we set indentation as we print new lines from
  // the format string. No matter how we exit this function, we should fix up
  // the indent to what it was before we entered; a cleanup makes it easy to
  // avoid this mistake.
  size_t original_indent = indent_;
  auto unindent =
      absl::MakeCleanup([this, original_indent] { indent_ = original_indent; });

  absl::string_view original = format;

  line_start_variables_.clear();

  if (opts.use_substitution_map) {
    substitutions_.clear();
  }

  auto fmt = TokenizeFormat(format, opts);
  PrintCodegenTrace(opts.loc);

  size_t arg_index = 0;
  bool skip_next_newline = false;
  std::vector<AnnotationCollector::Annotation> annot_stack;
  std::vector<std::pair<absl::string_view, size_t>> annot_records;
  for (size_t line_idx = 0; line_idx < fmt.lines.size(); ++line_idx) {
    const auto& line = fmt.lines[line_idx];

    // We only print a newline for lines that follow the first; a loop iteration
    // can also hint that we should not emit another newline through the
    // `skip_next_newline` variable.
    //
    // We also assume that double newlines are undesirable, so we
    // do not emit a newline if we are at the beginning of a line, *unless* the
    // previous format line is actually empty. This behavior is specific to
    // raw strings.
    if (line_idx > 0) {
      bool prev_was_empty = fmt.lines[line_idx - 1].chunks.empty();
      bool should_skip_newline =
          skip_next_newline ||
          (fmt.is_raw_string && (at_start_of_line_ && !prev_was_empty));
      if (!should_skip_newline) {
        line_start_variables_.clear();
        sink_.Write("\n");
        at_start_of_line_ = true;
      }
    }
    skip_next_newline = false;

    indent_ = original_indent + line.indent;

    for (size_t chunk_idx = 0; chunk_idx < line.chunks.size(); ++chunk_idx) {
      auto chunk = line.chunks[chunk_idx];

      if (!chunk.is_var) {
        PrintRaw(chunk.text);
        continue;
      }

      if (chunk.text.empty()) {
        // `$$` is an escape for just `$`.
        WriteRaw(&options_.variable_delimiter, 1);
        continue;
      }

      // If we get this far, we can conclude the chunk is a substitution
      // variable; we rename the `chunk` variable to make this clear below.
      absl::string_view var = chunk.text;
      if (substitution_listener_ != nullptr) {
        substitution_listener_(var, opts.loc.value_or(SourceLocation()));
      }
      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "{")) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        if (!Validate(absl::ascii_isdigit(var[0]), opts,
                      "expected digit after {")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }

        if (idx == arg_index) {
          ++arg_index;
        }

        IndentIfAtStart();
        annot_stack.push_back({{sink_.bytes_written(), 0}, args[idx]});
        continue;
      }

      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "}")) {
        // The rest of var is actually ignored, and this is apparently
        // public API now. Oops?
        if (!Validate(!annot_stack.empty(), opts,
                      "unexpected end of annotation")) {
          continue;
        }

        annot_stack.back().first.second = sink_.bytes_written();
        if (options_.annotation_collector != nullptr) {
          options_.annotation_collector->AddAnnotationNew(annot_stack.back());
        }
        annot_stack.pop_back();
        continue;
      }

      absl::string_view prefix, suffix;
      if (opts.strip_spaces_around_vars) {
        var = absl::StripLeadingAsciiWhitespace(var);
        prefix = chunk.text.substr(0, chunk.text.size() - var.size());
        var = absl::StripTrailingAsciiWhitespace(var);
        suffix = chunk.text.substr(prefix.size() + var.size());
      }

      if (!Validate(!var.empty(), opts, "unexpected empty variable")) {
        continue;
      }

      bool is_start = absl::ConsumePrefix(&var, "_start$");
      bool is_end = absl::ConsumePrefix(&var, "_end$");
      if (opts.use_annotation_frames && (is_start || is_end)) {
        if (is_start) {
          IndentIfAtStart();
          annot_records.push_back({var, sink_.bytes_written()});

          // Skip all whitespace immediately after a _start.
          ++chunk_idx;
          if (chunk_idx < line.chunks.size()) {
            absl::string_view text = line.chunks[chunk_idx].text;
            while (absl::ConsumePrefix(&text, " ")) {
            }
            PrintRaw(text);
          }
        } else {
          // If a line consisted *only* of an _end, this will likely result in
          // a blank line if we do not zap the newline after it, so we do that
          // here.
          if (line.chunks.size() == 1) {
            skip_next_newline = true;
          }

          auto record_var = annot_records.back();
          annot_records.pop_back();

          if (!Validate(record_var.first == var, opts, [record_var, var] {
                return absl::StrFormat(
                    "_start and _end variables must match, but got %s and %s, "
                    "respectively",
                    record_var.first, var);
              })) {
            continue;
          }

          absl::optional<AnnotationRecord> record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));

          if (!Validate(record.has_value(), opts, [var] {
                return absl::StrCat("undefined annotation variable: \"",
                                    absl::CHexEscape(var), "\"");
              })) {
            continue;
          }

          if (options_.annotation_collector != nullptr) {
            options_.annotation_collector->AddAnnotation(
                record_var.second, sink_.bytes_written(), record->file_path,
                record->path, record->semantic);
          }
        }

        continue;
      }

      absl::optional<ValueView> sub;
      absl::optional<AnnotationRecord> same_name_record;
      if (opts.allow_digit_substitutions && absl::ascii_isdigit(var[0])) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }
        if (idx == arg_index) {
          ++arg_index;
        }
        sub = args[idx];
      } else {
        sub = LookupInFrameStack(var, absl::MakeSpan(var_lookups_));

        if (opts.use_annotation_frames) {
          same_name_record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));
        }
      }

      // By returning here in case of empty we also skip possible spaces inside
      // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty
      // case.
      if (!Validate(sub.has_value(), opts, [var] {
            return absl::StrCat("undefined variable: \"", absl::CHexEscape(var),
                                "\"");
          })) {
        continue;
      }

      size_t range_start = sink_.bytes_written();
      size_t range_end = sink_.bytes_written();

      if (const absl::string_view* str = sub->AsString()) {
        if (at_start_of_line_ && str->empty()) {
          line_start_variables_.emplace_back(var);
        }

        if (!str->empty()) {
          // If `sub` is empty, we do not print the spaces around it.
          PrintRaw(prefix);
          PrintRaw(*str);
          range_end = sink_.bytes_written();
          range_start = range_end - str->size();
          PrintRaw(suffix);
        }
      } else {
        const ValueView::Callback* fnc = sub->AsCallback();
        ABSL_CHECK(fnc != nullptr);

        Validate(
            prefix.empty() && suffix.empty(), opts,
            "substitution that resolves to callback cannot contain whitespace");

        range_start = sink_.bytes_written();
        ABSL_CHECK((*fnc)())
            << "recursive call encountered while evaluating \"" << var << "\"";
        range_end = sink_.bytes_written();
      }

      if (range_start == range_end && sub->consume_parens_if_empty) {
        paren_depth_to_omit_.push_back(paren_depth_ + 1);
      }

      // If we just evaluated a value which specifies end-of-line consume-after
      // characters, and we're at the start of a line, that means we finished
      // with a newline.
      //
      // We trim a single end-of-line `consume_after` character in this case.
      //
      // This helps callback formatting "work as expected" with respect to forms
      // like
      //
      //   class Foo {
      //     $methods$;
      //   };
      //
      // Without this post-processing, it would turn into
      //
      //   class Foo {
      //     void Bar() {};
      //   };
      //
      // in many cases. Without the `;`, clang-format may format the template
      // incorrectly.
      auto next_idx = chunk_idx + 1;
      if (!sub->consume_after.empty() && next_idx < line.chunks.size() &&
          !line.chunks[next_idx].is_var) {
        chunk_idx = next_idx;

        absl::string_view text = line.chunks[chunk_idx].text;
        for (char c : sub->consume_after) {
          if (absl::ConsumePrefix(&text, absl::string_view(&c, 1))) {
            break;
          }
        }

        PrintRaw(text);
      }

      if (same_name_record.has_value() &&
          options_.annotation_collector != nullptr) {
        options_.annotation_collector->AddAnnotation(
            range_start, range_end, same_name_record->file_path,
            same_name_record->path, same_name_record->semantic);
      }

      if (opts.use_substitution_map) {
        auto insertion =
            substitutions_.emplace(var, std::make_pair(range_start, range_end));

        if (!insertion.second) {
          // This variable was used multiple times.
          // Make its span have negative length so
          // we can detect it if it gets used in an
          // annotation.
          insertion.first->second = {1, 0};
        }
      }
    }
  }

  Validate(arg_index == args.size(), opts,
           [original] { return absl::StrCat("unused args: ", original); });
  Validate(annot_stack.empty(), opts, [this, original] {
    return absl::StrFormat(
        "annotation range was not closed; expected %c}%c: %s",
        options_.variable_delimiter, options_.variable_delimiter, original);
  });

  // For multiline raw strings, we always make sure to end on a newline.
  if (fmt.is_raw_string && !at_start_of_line_) {
    PrintRaw("\n");
    at_start_of_line_ = true;
  }
}